

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

VTimeZone * __thiscall icu_63::VTimeZone::operator=(VTimeZone *this,VTimeZone *right)

{
  int iVar1;
  ulong in_RAX;
  undefined4 extraout_var;
  UVector *pUVar2;
  long *plVar3;
  void *obj;
  int32_t initialCapacity;
  VTimeZone *size;
  ulong uStack_38;
  UErrorCode status;
  
  if (this == right) {
    return this;
  }
  uStack_38 = in_RAX;
  iVar1 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x15])(this);
  if ((char)iVar1 == '\0') {
    return this;
  }
  size = right;
  TimeZone::operator=((TimeZone *)this,(TimeZone *)right);
  if (this->tz != (BasicTimeZone *)0x0) {
    (*(this->tz->super_TimeZone).super_UObject._vptr_UObject[1])();
    this->tz = (BasicTimeZone *)0x0;
  }
  if (right->tz != (BasicTimeZone *)0x0) {
    iVar1 = (*(right->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
    this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar1);
  }
  if (this->vtzlines != (UVector *)0x0) {
    (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
  }
  if (right->vtzlines == (UVector *)0x0) goto LAB_0020e465;
  uStack_38 = uStack_38 & 0xffffffff;
  initialCapacity = right->vtzlines->count;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
  if (pUVar2 == (UVector *)0x0) {
    this->vtzlines = (UVector *)0x0;
LAB_0020e40a:
    iVar1 = 0;
    if (initialCapacity < 1) {
      initialCapacity = 0;
    }
    do {
      if (initialCapacity == iVar1) goto LAB_0020e465;
      plVar3 = (long *)UVector::elementAt(right->vtzlines,iVar1);
      pUVar2 = this->vtzlines;
      obj = (void *)(**(code **)(*plVar3 + 0x38))(plVar3);
      UVector::addElement(pUVar2,obj,&status);
      iVar1 = iVar1 + 1;
    } while (status < U_ILLEGAL_ARGUMENT_ERROR);
    pUVar2 = this->vtzlines;
    if (pUVar2 == (UVector *)0x0) goto LAB_0020e465;
  }
  else {
    UVector::UVector(pUVar2,uprv_deleteUObject_63,uhash_compareUnicodeString_63,initialCapacity,
                     &status);
    this->vtzlines = pUVar2;
    if (status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020e40a;
  }
  (*(pUVar2->super_UObject)._vptr_UObject[1])(pUVar2);
  this->vtzlines = (UVector *)0x0;
LAB_0020e465:
  UnicodeString::operator=(&this->tzurl,&right->tzurl);
  this->lastmod = right->lastmod;
  UnicodeString::operator=(&this->olsonzid,&right->olsonzid);
  UnicodeString::operator=(&this->icutzver,&right->icutzver);
  return this;
}

Assistant:

VTimeZone&
VTimeZone::operator=(const VTimeZone& right) {
    if (this == &right) {
        return *this;
    }
    if (*this != right) {
        BasicTimeZone::operator=(right);
        if (tz != NULL) {
            delete tz;
            tz = NULL;
        }
        if (right.tz != NULL) {
            tz = (BasicTimeZone*)right.tz->clone();
        }
        if (vtzlines != NULL) {
            delete vtzlines;
        }
        if (right.vtzlines != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            int32_t size = right.vtzlines->size();
            vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
            if (U_SUCCESS(status)) {
                for (int32_t i = 0; i < size; i++) {
                    UnicodeString *line = (UnicodeString*)right.vtzlines->elementAt(i);
                    vtzlines->addElement(line->clone(), status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                }
            }
            if (U_FAILURE(status) && vtzlines != NULL) {
                delete vtzlines;
                vtzlines = NULL;
            }
        }
        tzurl = right.tzurl;
        lastmod = right.lastmod;
        olsonzid = right.olsonzid;
        icutzver = right.icutzver;
    }
    return *this;
}